

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressor.cpp
# Opt level: O3

Compressor * Imf_3_4::newCompressor(Compression c,size_t maxScanLineSize,Header *hdr)

{
  Compressor *this;
  
  switch(c) {
  case RLE_COMPRESSION:
    this = (Compressor *)operator_new(0x458);
    RleCompressor::RleCompressor((RleCompressor *)this,hdr,maxScanLineSize);
    break;
  case ZIPS_COMPRESSION:
    this = (Compressor *)operator_new(0x458);
    ZipCompressor::ZipCompressor((ZipCompressor *)this,hdr,maxScanLineSize,1);
    break;
  case ZIP_COMPRESSION:
    this = (Compressor *)operator_new(0x458);
    ZipCompressor::ZipCompressor((ZipCompressor *)this,hdr,maxScanLineSize,0x10);
    break;
  case PIZ_COMPRESSION:
    this = (Compressor *)operator_new(0x458);
    PizCompressor::PizCompressor((PizCompressor *)this,hdr,maxScanLineSize,0x20);
    break;
  case PXR24_COMPRESSION:
    this = (Compressor *)operator_new(0x458);
    Pxr24Compressor::Pxr24Compressor((Pxr24Compressor *)this,hdr,maxScanLineSize,0x10);
    break;
  case B44_COMPRESSION:
    this = (Compressor *)operator_new(0x458);
    B44Compressor::B44Compressor((B44Compressor *)this,hdr,maxScanLineSize,0x20,false);
    break;
  case B44A_COMPRESSION:
    this = (Compressor *)operator_new(0x458);
    B44Compressor::B44Compressor((B44Compressor *)this,hdr,maxScanLineSize,0x20,true);
    break;
  case DWAA_COMPRESSION:
    this = (Compressor *)operator_new(0x458);
    DwaCompressor::DwaCompressor
              ((DwaCompressor *)this,hdr,(long)(int)maxScanLineSize,0x20,STATIC_HUFFMAN);
    break;
  case DWAB_COMPRESSION:
    this = (Compressor *)operator_new(0x458);
    DwaCompressor::DwaCompressor
              ((DwaCompressor *)this,hdr,(long)(int)maxScanLineSize,0x100,STATIC_HUFFMAN);
    break;
  default:
    return (Compressor *)0x0;
  }
  if (this->_store_type == EXR_STORAGE_LAST_TYPE) {
    this->_store_type = EXR_STORAGE_SCANLINE;
  }
  return this;
}

Assistant:

Compressor*
newCompressor (Compression c, size_t maxScanLineSize, const Header& hdr)
{
    Compressor* ret = nullptr;

    // clang-format off
    switch (c)
    {
        case RLE_COMPRESSION:

            ret = new RleCompressor (hdr, maxScanLineSize);
            break;

        case ZIPS_COMPRESSION:

            ret = new ZipCompressor (hdr, maxScanLineSize, 1);
            break;

        case ZIP_COMPRESSION:

            ret = new ZipCompressor (hdr, maxScanLineSize, 16);
            break;

        case PIZ_COMPRESSION:

            ret = new PizCompressor (hdr, maxScanLineSize, 32);
            break;

        case PXR24_COMPRESSION:

            ret = new Pxr24Compressor (hdr, maxScanLineSize, 16);
            break;

        case B44_COMPRESSION:

            ret = new B44Compressor (hdr, maxScanLineSize, 32, false);
            break;

        case B44A_COMPRESSION:

            ret = new B44Compressor (hdr, maxScanLineSize, 32, true);
            break;

        case DWAA_COMPRESSION:

            ret = new DwaCompressor (
                hdr,
                static_cast<int> (maxScanLineSize),
                32,
                DwaCompressor::STATIC_HUFFMAN);
            break;

        case DWAB_COMPRESSION:

            ret = new DwaCompressor (
                hdr,
                static_cast<int> (maxScanLineSize),
                256,
                DwaCompressor::STATIC_HUFFMAN);
            break;

        default: break;
    }
    // clang-format on

    if (ret && ret->storageType () == EXR_STORAGE_LAST_TYPE)
        ret->setStorageType (EXR_STORAGE_SCANLINE);

    return ret;
}